

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimation
          (OgreBinarySerializer *this,Skeleton *skeleton)

{
  uint16_t uVar1;
  Animation *this_00;
  ulong uVar2;
  Logger *this_01;
  ostream *poVar3;
  Skeleton *pSVar4;
  bool bVar5;
  float fVar6;
  Animation *anim;
  char *local_1c0 [4];
  string local_1a0 [11];
  
  this_00 = (Animation *)operator_new(0x70);
  Animation::Animation(this_00,skeleton);
  anim = this_00;
  ReadLine_abi_cxx11_(local_1a0,this);
  std::__cxx11::string::operator=((string *)&this_00->name,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  fVar6 = Read<float>(this);
  this_00->length = fVar6;
  if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
LAB_0043e493:
    std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::push_back
              (&skeleton->animations,&anim);
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [5])0x611064);
    std::operator<<((ostream *)local_1a0,(string *)&anim->name);
    std::operator<<((ostream *)local_1a0," (");
    poVar3 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_1a0,&anim->length);
    std::operator<<(poVar3," sec, ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," tracks)");
    std::__cxx11::stringbuf::str();
    Logger::debug(this_01,local_1c0[0]);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    return;
  }
  pSVar4 = (Skeleton *)0x1;
  uVar1 = ReadHeader(this,true);
  if (uVar1 != 0x4010) goto LAB_0043e44d;
  ReadLine_abi_cxx11_(local_1a0,this);
  std::__cxx11::string::operator=((string *)&this_00->baseName,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  fVar6 = Read<float>(this);
  this_00->baseTime = fVar6;
  do {
    pSVar4 = (Skeleton *)0x1;
    uVar1 = ReadHeader(this,true);
LAB_0043e44d:
    bVar5 = uVar1 != 0x4100;
    do {
      uVar2 = (long)this->m_reader->end - (long)this->m_reader->current;
      if ((bVar5) || ((uVar2 & 0xffffffff) == 0)) {
        if ((int)uVar2 != 0) {
          RollbackHeader(this);
        }
        goto LAB_0043e493;
      }
      ReadSkeletonAnimationTrack(this,pSVar4,this_00);
      bVar5 = false;
    } while (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current);
  } while( true );
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimation(Skeleton *skeleton)
{
    Animation *anim = new Animation(skeleton);
    anim->name = ReadLine();
    anim->length = Read<float>();

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        if (id == SKELETON_ANIMATION_BASEINFO)
        {
            anim->baseName = ReadLine();
            anim->baseTime = Read<float>();

            // Advance to first track
            id = ReadHeader();
        }

        while (!AtEnd() && id == SKELETON_ANIMATION_TRACK)
        {
            ReadSkeletonAnimationTrack(skeleton, anim);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    skeleton->animations.push_back(anim);

    ASSIMP_LOG_DEBUG_F( "    ", anim->name, " (", anim->length, " sec, ", anim->tracks.size(), " tracks)");
}